

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlDebugDumpAttrList(FILE *output,xmlAttrPtr attr,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_b0;
  
  if (output != (FILE *)0x0) {
    local_b0.nodict = 0;
    local_b0.options = 0;
    local_b0.doc = (xmlDocPtr)0x0;
    local_b0.node = (xmlNodePtr)0x0;
    local_b0.dict = (xmlDictPtr)0x0;
    local_b0.check = 0;
    local_b0.errors = 0;
    builtin_strncpy(local_b0.shift,
                    "                                                                                                    "
                    ,0x65);
    if (attr != (xmlAttrPtr)0x0) {
      local_b0.output = output;
      local_b0.depth = depth;
      do {
        xmlCtxtDumpAttr(&local_b0,attr);
        attr = attr->next;
      } while (attr != (_xmlAttr *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlDebugDumpAttrList(FILE * output, xmlAttrPtr attr, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpAttrList(&ctxt, attr);
    xmlCtxtDumpCleanCtxt(&ctxt);
}